

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxiliaryMemorySwitches.hpp
# Opt level: O3

void __thiscall
Apple::II::
AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>_>
::set_card_paging(AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>_>
                  *this)

{
  bool bVar1;
  undefined1 uVar2;
  CardState CVar3;
  bool bVar4;
  
  CVar3 = this->card_state_;
  bVar1 = (this->switches_).internal_CX_rom;
  (this->card_state_).region_C4_C8 = bVar1;
  (this->card_state_).region_C1_C3 = bVar1;
  if ((bVar1 != false) || (bVar4 = true, (this->switches_).slot_C3_rom == true)) {
    bVar4 = bVar1;
  }
  (this->card_state_).region_C3 = bVar4;
  uVar2 = true;
  if ((bVar1 & 1U) == 0) {
    uVar2 = (this->switches_).internal_C8_rom;
  }
  (this->card_state_).region_C8_D0 = (bool)uVar2;
  if (CVar3.region_C8_D0 != (bool)uVar2 ||
      (CVar3.region_C4_C8 != bVar1 || (bVar4 != CVar3.region_C3 || CVar3.region_C1_C3 != bVar1))) {
    ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>::set_paging<4>
              (this->machine_);
    return;
  }
  return;
}

Assistant:

void set_card_paging() {
			const auto previous_state = card_state_;

			// By default apply the CX switch through to $C7FF.
			card_state_.region_C1_C3 = card_state_.region_C4_C8 = switches_.internal_CX_rom;

			// Allow the C3 region to be switched to internal ROM in isolation even if the rest of the
			// first half of the CX region is diabled, if its specific switch is also disabled.
			if(!switches_.internal_CX_rom && !switches_.slot_C3_rom) {
				card_state_.region_C3 = true;
			} else {
				card_state_.region_C3 = card_state_.region_C1_C3;
			}

			// Apply the CX switch to $C800+, but also allow the C8 switch to select that region in isolation.
			card_state_.region_C8_D0 = switches_.internal_CX_rom || switches_.internal_C8_rom;

			if(previous_state != card_state_) {
				machine_.template set_paging<PagingType::CardArea>();
			}
		}